

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyImplPrivate::createCache(QNetworkReplyImplPrivate *this)

{
  undefined1 uVar1;
  QAbstractNetworkCache *pQVar2;
  QNetworkRequest *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyImplPrivate *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar3;
  undefined1 in_stack_ffffffffffffffac;
  uint uVar4;
  Attribute code;
  undefined2 uVar5;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = networkCache(in_stack_ffffffffffffff88);
  uVar4 = (uint)CONCAT11(1,in_stack_ffffffffffffffac);
  if (pQVar2 != (QAbstractNetworkCache *)0x0) {
    this_00 = (QNetworkRequest *)(in_RDI + 0x1d0);
    QVariant::QVariant(&local_48,true);
    code = CONCAT13(1,(int3)uVar4);
    QNetworkRequest::attribute
              (this_00,code,
               (QVariant *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    uVar5 = (undefined2)(CONCAT13((char)(code >> 0x18),0x10000) >> 0x10);
    uVar1 = QVariant::toBool();
    uVar4 = (uint)CONCAT21(uVar5,uVar1) << 8 ^ 0xff00;
  }
  bVar3 = (byte)(uVar4 >> 8);
  if ((uVar4 & 0x10000) != 0) {
    QVariant::~QVariant(&local_28);
  }
  if ((uVar4 & 0x1000000) != 0) {
    QVariant::~QVariant(&local_48);
  }
  if ((bVar3 & 1) == 0) {
    *(undefined1 *)(in_RDI + 600) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::createCache()
{
    // check if we can save and if we're allowed to
    if (!networkCache()
        || !request.attribute(QNetworkRequest::CacheSaveControlAttribute, true).toBool())
        return;
    cacheEnabled = true;
}